

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O2

void __thiscall RandomizerWorld::load_hint_sources(RandomizerWorld *this)

{
  bool bVar1;
  reference json;
  HintSource *new_source;
  Json hint_sources_json;
  _Any_data local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  iterator __end1;
  iterator __begin1;
  
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  uStack_70 = 0;
  nlohmann::
  basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<unsigned_char_const(&)[52249]>
            ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&hint_sources_json,
             (uchar (*) [52249])
             "[\n    {\n        \"description\": \"Lithograph\",\n        \"smallTextbox\": true\n    },\n    {\n        \"description\": \"Oracle Stone\",\n        \"smallTextbox\": true\n    },\n    {\n        \"description\": \"Mercator fortune teller\",\n        \"textIds\": [\n            654\n        ]\n    },\n    {\n        \"description\": \"King Nole\'s Cave sign\",\n        \"textIds\": [\n            253\n        ]\n    },\n    {\n        \"description\": \"Foxy (next to Ryuma\'s mayor house)\",\n        \"entity\": {\n            \"mapId\": 611,\n            \"position\": {\n                \"x\": 47,\n                \"y\": 25,\n                \"z\": 3\n            },\n            \"orientation\": \"sw\"\n        },\n        \"nodeId\": \"ryuma\"\n    },\n    {\n        \"description\": \"Foxy (behind trees in Gumi)\",\n        \"entity\": {\n            \"mapId\": [ 602, 603 ],\n            \"position\": {\n                \"x\": 24,\n                \"y\": 35,\n                \"z\": 6\n            },\n            \"orientation\": \"sw\"\n        },\n        \"nodeId\": \"gumi\"\n    },\n    {\n        \"description\": \"Foxy (next to Mercator gates)\",\n        \"entity\": {\n            \"mapId\": 454,\n            \"position\": {\n                \"x\": 18,\n                \"y\": 46,\n                \"z\": 0\n            },\n            \"orientation\": \"se\"\n        },\n        \"nodeId\": \"route_gumi_ryuma\"\n    },\n    {\n        \"description\": \"Foxy (near basin behind Mercator)\",\n        \"entity\": {\n            \"mapId\": 636,\n            \"position\": {\n                \"x\": 18,\n                \"y\": 27,\n                \"z\": 1\n            },\n            \"orientation\": \"nw\"\n        },\n        \"nodeId\": \"mercator\"\n    },\n    {\n        \"description\": \"Foxy (near cabin on Verla Shore)\",\n        \"entity\": {\n            \"mapId\": 468,\n            \"position\": {\n                \"x\": 24,\n                \"y\": 45,\n                \"z\": 1\n            },\n            \"orientation\": \"se\"\n        },\n        \"nodeId\": \"verla_shore\"\n    },\n    {\n        \"description\": \"Foxy (outside Verla Mines entrance)\",\n        \"entity\": {\n            \"mapId\": 470,\n            \"position\": {\n..." /* TRUNCATED STRING LITERAL */
             ,(parser_callback_t *)&local_88,true,true);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::begin(&__begin1,&hint_sources_json);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::end(&__end1,&hint_sources_json);
  while( true ) {
    bVar1 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&__begin1,&__end1);
    if (!bVar1) break;
    json = nlohmann::detail::
           iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::operator*(&__begin1);
    new_source = HintSource::from_json(json,&this->_nodes);
    std::vector<HintSource*,std::allocator<HintSource*>>::emplace_back<HintSource*&>
              ((vector<HintSource*,std::allocator<HintSource*>> *)&this->_hint_sources,&new_source);
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++(&__begin1);
  }
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&hint_sources_json);
  return;
}

Assistant:

void RandomizerWorld::load_hint_sources()
{
    Json hint_sources_json = Json::parse(HINT_SOURCES_JSON, nullptr, true, true);
    for(const Json& hint_source_json : hint_sources_json)
    {
        HintSource* new_source = HintSource::from_json(hint_source_json, _nodes);
        _hint_sources.emplace_back(new_source);
    }
}